

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SySetAlloc(SySet *pSet,sxi32 nItem)

{
  sxi32 in_EAX;
  void *pvVar1;
  
  if (pSet->nSize != 0) {
    return in_EAX;
  }
  pvVar1 = SyMemBackendAlloc(pSet->pAllocator,pSet->eSize * nItem);
  pSet->pBase = pvVar1;
  if (pvVar1 != (void *)0x0) {
    pSet->nSize = nItem;
  }
  return (sxi32)pvVar1;
}

Assistant:

JX9_PRIVATE sxi32 SySetAlloc(SySet *pSet, sxi32 nItem)
{
	if( pSet->nSize > 0 ){
		return SXERR_LOCKED;
	}
	if( nItem < 8 ){
		nItem = 8;
	}
	pSet->pBase = SyMemBackendAlloc(pSet->pAllocator, pSet->eSize * nItem);
	if( pSet->pBase == 0 ){
		return SXERR_MEM;
	}
	pSet->nSize = nItem;
	return SXRET_OK;
}